

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invalid_address.cpp
# Opt level: O0

void __thiscall n_e_s::core::InvalidAddress::InvalidAddress(InvalidAddress *this,uint16_t addr)

{
  string *__return_storage_ptr__;
  undefined6 in_register_00000032;
  v8 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  undefined1 local_b2 [8];
  uint16_t addr_local;
  InvalidAddress *this_local;
  undefined1 local_90 [16];
  v8 *local_80;
  char *local_78;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short> *local_70
  ;
  char *local_68;
  undefined8 uStack_60;
  string *local_58;
  char **local_50;
  char *local_48;
  char *pcStack_40;
  InvalidAddress **local_38;
  undefined1 *local_30;
  InvalidAddress **local_28;
  InvalidAddress **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  this_00 = (v8 *)CONCAT62(in_register_00000032,addr);
  local_b2._0_2_ = addr;
  unique0x100000c5 = this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__InvalidAddress_002238f0;
  __return_storage_ptr__ = &this->message_;
  local_68 = "Invalid address [0x{:04X}]";
  uStack_60 = 0x1a;
  local_70 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_short>
              *)local_b2;
  local_50 = &local_68;
  local_80 = (v8 *)0x1c80c4;
  local_78 = (char *)0x1a;
  local_58 = __return_storage_ptr__;
  local_48 = (char *)local_80;
  pcStack_40 = local_78;
  this_local = (InvalidAddress *)
               ::fmt::v8::
               make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_short&>
                         (local_70,this_00,(unsigned_short *)__return_storage_ptr__);
  local_30 = local_90;
  local_38 = &this_local;
  local_18 = 2;
  fmt.size_ = 2;
  fmt.data_ = local_78;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_38;
  local_28 = local_38;
  local_20 = local_38;
  local_10 = local_30;
  ::fmt::v8::vformat_abi_cxx11_(__return_storage_ptr__,local_80,fmt,args);
  return;
}

Assistant:

InvalidAddress::InvalidAddress(uint16_t addr)
        : message_(fmt::format("Invalid address [0x{:04X}]", addr)) {}